

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O0

void __thiscall FIX::DataDictionary::readFromDocument(DataDictionary *this,DOMDocumentPtr *pDoc)

{
  undefined4 field;
  bool bVar1;
  uint uVar2;
  int iVar3;
  Type type_00;
  pointer pDVar4;
  pointer pDVar5;
  ConfigError *pCVar6;
  pointer pDVar7;
  char *__nptr;
  bool local_1152;
  bool local_112a;
  bool local_1114;
  bool local_1112;
  bool local_10cb;
  bool local_103a;
  bool local_101a;
  bool local_fda;
  bool local_f82;
  bool local_f62;
  bool local_f22;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_d60;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_d58;
  bool local_d4a;
  allocator<char> local_d49;
  string local_d48 [6];
  bool isRequired_5;
  undefined1 local_d28 [8];
  string required_6;
  DOMAttributesPtr attrs_10;
  allocator<char> local_cd9;
  string local_cd8 [6];
  bool isRequired_4;
  undefined1 local_cb8 [8];
  string required_5;
  DOMAttributesPtr attrs_9;
  allocator<char> local_c69;
  string local_c68 [32];
  undefined1 local_c48 [8];
  string required_4;
  int num_1;
  allocator<char> local_bf9;
  string local_bf8 [32];
  undefined1 local_bd8 [8];
  string name_4;
  DOMAttributesPtr attrs_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_b68;
  DOMNodePtr pMessageFieldNode;
  string local_b58 [32];
  undefined1 local_b38 [8];
  string name_3;
  string local_b10;
  allocator<char> local_ae9;
  string local_ae8 [32];
  undefined1 local_ac8 [8];
  string msgtype;
  DOMAttributesPtr attrs_7;
  allocator<char> local_a79;
  string local_a78;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_a58;
  DOMNodePtr pMessageNode;
  string local_a48;
  allocator<char> local_a21;
  string local_a20 [32];
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_a00;
  DOMNodePtr pMessagesNode;
  allocator<char> local_9e9;
  string local_9e8;
  bool local_9c2;
  allocator<char> local_9c1;
  string local_9c0 [6];
  bool isRequired_3;
  undefined1 local_9a0 [8];
  string required_3;
  DOMAttributesPtr attrs_6;
  allocator<char> local_951;
  string local_950 [6];
  bool isRequired_2;
  undefined1 local_930 [8];
  string required_2;
  string local_908;
  allocator<char> local_8e1;
  string local_8e0 [32];
  undefined1 local_8c0 [8];
  string name_2;
  DOMAttributesPtr attrs_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  undefined1 local_84a;
  allocator<char> local_849;
  string local_848;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_828;
  DOMNodePtr pTrailerFieldNode;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0 [32];
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_7d0;
  DOMNodePtr pTrailerNode;
  allocator<char> local_7b9;
  string local_7b8;
  bool local_792;
  allocator<char> local_791;
  string local_790 [6];
  bool isRequired_1;
  undefined1 local_770 [8];
  string required_1;
  DOMAttributesPtr attrs_4;
  allocator<char> local_721;
  string local_720 [6];
  bool isRequired;
  undefined1 local_700 [8];
  string required;
  string local_6d8;
  allocator<char> local_6b1;
  string local_6b0 [32];
  undefined1 local_690 [8];
  string name_1;
  DOMAttributesPtr attrs_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  undefined1 local_61a;
  allocator<char> local_619;
  string local_618;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_5f8;
  DOMNodePtr pHeaderFieldNode;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0 [32];
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_5a0;
  DOMNodePtr pHeaderNode;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_590;
  allocator<char> local_581;
  string local_580 [32];
  undefined1 local_560 [8];
  string description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  allocator<char> local_511;
  string local_510 [32];
  undefined1 local_4f0 [8];
  string enumeration;
  DOMAttributesPtr attrs_2;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_4a8;
  DOMNodePtr pFieldValueNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  allocator<char> local_451;
  string local_450 [32];
  undefined1 local_430 [8];
  string type_1;
  int num;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  allocator<char> local_3c1;
  string local_3c0 [32];
  string local_3a0 [8];
  string number;
  string local_378;
  allocator<char> local_351;
  string local_350 [32];
  undefined1 local_330 [8];
  string name;
  DOMAttributesPtr attrs_1;
  allocator<char> local_2e1;
  string local_2e0;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_2c0;
  DOMNodePtr pFieldNode;
  string local_2b0;
  allocator<char> local_289;
  string local_288 [32];
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_268;
  DOMNodePtr pFieldsNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1da;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0 [32];
  undefined1 local_190 [8];
  string minor;
  string local_168;
  allocator<char> local_141;
  string local_140 [32];
  undefined1 local_120 [8];
  string major;
  string local_f8;
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  undefined1 local_a8 [8];
  string type;
  DOMAttributesPtr attrs;
  string local_78;
  allocator<char> local_41;
  string local_40 [32];
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_20;
  DOMNodePtr pFixNode;
  DOMDocumentPtr *pDoc_local;
  DataDictionary *this_local;
  
  pFixNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t.
  super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
  super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl =
       (__uniq_ptr_data<FIX::DOMNode,_std::default_delete<FIX::DOMNode>,_true,_true>)
       (__uniq_ptr_data<FIX::DOMNode,_std::default_delete<FIX::DOMNode>,_true,_true>)pDoc;
  pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::operator->
                     (pDoc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/fix",&local_41);
  (*pDVar4->_vptr_DOMDocument[5])(&local_20,pDVar4,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_20);
  if (pDVar5 == (pointer)0x0) {
    attrs._M_t.super___uniq_ptr_impl<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>.
    _M_t.super__Tuple_impl<0UL,_FIX::DOMAttributes_*,_std::default_delete<FIX::DOMAttributes>_>.
    super__Head_base<0UL,_FIX::DOMAttributes_*,_false>._M_head_impl._6_1_ = 1;
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "Could not parse data dictionary file, or no <fix> node found at root",
               (allocator<char> *)
               ((long)&attrs._M_t.
                       super___uniq_ptr_impl<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_FIX::DOMAttributes_*,_std::default_delete<FIX::DOMAttributes>_>
                       .super__Head_base<0UL,_FIX::DOMAttributes_*,_false>._M_head_impl + 7));
    ConfigError::ConfigError(pCVar6,&local_78);
    attrs._M_t.super___uniq_ptr_impl<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>.
    _M_t.super__Tuple_impl<0UL,_FIX::DOMAttributes_*,_std::default_delete<FIX::DOMAttributes>_>.
    super__Head_base<0UL,_FIX::DOMAttributes_*,_false>._M_head_impl._6_1_ = 0;
    __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->(&local_20);
  (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&type.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"FIX",&local_a9);
  std::allocator<char>::~allocator(&local_a9);
  pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::operator->
                     ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                      ((long)&type.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"type",&local_d1);
  uVar2 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_d0,local_a8);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  if ((((uVar2 & 1) != 0) &&
      (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a8,"FIX"), bVar1)) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a8,"FIXT"), bVar1)) {
    major.field_2._M_local_buf[0xe] = '\x01';
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"type attribute must be FIX or FIXT",
               (allocator<char> *)(major.field_2._M_local_buf + 0xf));
    ConfigError::ConfigError(pCVar6,&local_f8);
    major.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  std::__cxx11::string::string((string *)local_120);
  pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::operator->
                     ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                      ((long)&type.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"major",&local_141);
  iVar3 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_140,local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
    minor.field_2._M_local_buf[0xe] = '\x01';
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"major attribute not found on <fix>",
               (allocator<char> *)(minor.field_2._M_local_buf + 0xf));
    ConfigError::ConfigError(pCVar6,&local_168);
    minor.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  std::__cxx11::string::string((string *)local_190);
  pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::operator->
                     ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                      ((long)&type.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"minor",&local_1b1);
  iVar3 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_1b0,local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
    local_1da = 1;
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"minor attribute not found on <fix>",&local_1d9);
    ConfigError::ConfigError(pCVar6,&local_1d8);
    local_1da = 0;
    __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pFieldsNode,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,".");
  std::operator+(&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pFieldsNode,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  std::operator+(&local_220,&local_240,".");
  std::operator+(&local_200,&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
  setVersion(this,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&pFieldsNode);
  pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::operator->
                     ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
                      pFixNode._M_t.
                      super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t.
                      super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
                      super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_288,"/fix/fields",&local_289);
  (*pDVar4->_vptr_DOMDocument[5])(&local_268,pDVar4,local_288);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_268);
  if (pDVar5 == (pointer)0x0) {
    pFieldNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t.
    super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
    super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._6_1_ = 1;
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"<fields> section not found in data dictionary",
               (allocator<char> *)
               ((long)&pFieldNode._M_t.
                       super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t.
                       super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
                       super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl + 7));
    ConfigError::ConfigError(pCVar6,&local_2b0);
    pFieldNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t.
    super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
    super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._6_1_ = 0;
    __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->(&local_268)
  ;
  (*pDVar5->_vptr_DOMNode[2])(&local_2c0);
  pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_2c0);
  if (pDVar5 == (pointer)0x0) {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"No fields defined",&local_2e1);
    ConfigError::ConfigError(pCVar6,&local_2e0);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  while (pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_2c0)
        , pDVar5 != (pointer)0x0) {
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_2c0);
    (*pDVar5->_vptr_DOMNode[5])(&attrs_1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &attrs_1,"field");
    std::__cxx11::string::~string((string *)&attrs_1);
    if (bVar1) {
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_2c0);
      (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&name.field_2 + 8));
      std::__cxx11::string::string((string *)local_330);
      pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
               operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                           *)((long)&name.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_350,"name",&local_351);
      iVar3 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_350,local_330);
      std::__cxx11::string::~string(local_350);
      std::allocator<char>::~allocator(&local_351);
      if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
        number.field_2._M_local_buf[0xe] = '\x01';
        pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,"<field> does not have a name attribute",
                   (allocator<char> *)(number.field_2._M_local_buf + 0xf));
        ConfigError::ConfigError(pCVar6,&local_378);
        number.field_2._M_local_buf[0xe] = '\0';
        __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
      }
      std::__cxx11::string::string(local_3a0);
      pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
               operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                           *)((long)&name.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3c0,"number",&local_3c1);
      iVar3 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_3c0,local_3a0);
      std::__cxx11::string::~string(local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
      if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
        type_1.field_2._M_local_buf[0xf] = '\x01';
        pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num,
                       "<field> ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330);
        std::operator+(&local_3e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num,
                       " does not have a number attribute");
        ConfigError::ConfigError(pCVar6,&local_3e8);
        type_1.field_2._M_local_buf[0xf] = '\0';
        __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
      }
      __nptr = (char *)std::__cxx11::string::c_str();
      type_1.field_2._8_4_ = atoi(__nptr);
      std::__cxx11::string::string((string *)local_430);
      pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
               operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                           *)((long)&name.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_450,"type",&local_451);
      iVar3 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_450,local_430);
      std::__cxx11::string::~string(local_450);
      std::allocator<char>::~allocator(&local_451);
      if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
        pFieldValueNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>
        ._M_t.super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
        super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._7_1_ = 1;
        pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
        std::operator+(&local_498,"<field> ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330);
        std::operator+(&local_478,&local_498," does not have a type attribute");
        ConfigError::ConfigError(pCVar6,&local_478);
        pFieldValueNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>
        ._M_t.super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
        super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._7_1_ = 0;
        __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
      }
      addField(this,type_1.field_2._8_4_);
      field = type_1.field_2._8_4_;
      type_00 = XMLTypeToType(this,(string *)local_430);
      addFieldType(this,field,type_00);
      addFieldName(this,type_1.field_2._8_4_,(string *)local_330);
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_2c0);
      (*pDVar5->_vptr_DOMNode[2])(&local_4a8);
      while (pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get
                                (&local_4a8), pDVar5 != (pointer)0x0) {
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_4a8);
        (*pDVar5->_vptr_DOMNode[5])(&attrs_2);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&attrs_2,"value");
        std::__cxx11::string::~string((string *)&attrs_2);
        if (bVar1) {
          pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                             (&local_4a8);
          (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&enumeration.field_2 + 8));
          std::__cxx11::string::string((string *)local_4f0);
          pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                   operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                               *)((long)&enumeration.field_2 + 8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_510,"enum",&local_511);
          iVar3 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_510,local_4f0);
          std::__cxx11::string::~string(local_510);
          std::allocator<char>::~allocator(&local_511);
          if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
            description.field_2._M_local_buf[0xf] = '\x01';
            pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
            std::operator+(&local_538,"<value> does not have enum attribute in field ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_330);
            ConfigError::ConfigError(pCVar6,&local_538);
            description.field_2._M_local_buf[0xf] = '\0';
            __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
          }
          addFieldValue(this,type_1.field_2._8_4_,(string *)local_4f0);
          std::__cxx11::string::string((string *)local_560);
          pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                   operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                               *)((long)&enumeration.field_2 + 8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_580,"description",&local_581);
          uVar2 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_580,local_560);
          std::__cxx11::string::~string(local_580);
          std::allocator<char>::~allocator(&local_581);
          if ((uVar2 & 1) != 0) {
            addValueName(this,type_1.field_2._8_4_,(string *)local_4f0,(string *)local_560);
          }
          std::__cxx11::string::~string((string *)local_560);
          std::__cxx11::string::~string((string *)local_4f0);
          std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                    ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                     ((long)&enumeration.field_2 + 8));
        }
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_4a8);
        (*pDVar5->_vptr_DOMNode[3])(&local_590);
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::release
                           (&local_590);
        std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::reset(&local_4a8,pDVar5);
        std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_590);
      }
      std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_4a8);
      std::__cxx11::string::~string((string *)local_430);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::string::~string((string *)local_330);
      std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                 ((long)&name.field_2 + 8));
    }
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_2c0);
    (*pDVar5->_vptr_DOMNode[3])(&pHeaderNode);
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::release
                       (&pHeaderNode);
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::reset(&local_2c0,pDVar5);
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&pHeaderNode);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a8,"FIXT");
  if ((bVar1) ||
     ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a8,"FIX"), bVar1 &&
      (bVar1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_120,"5"), bVar1)))) {
    pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::operator->
                       ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
                        pFixNode._M_t.
                        super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t
                        .super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
                        super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_5c0,"/fix/header",&local_5c1);
    (*pDVar4->_vptr_DOMDocument[5])(&local_5a0,pDVar4,local_5c0);
    std::__cxx11::string::~string(local_5c0);
    std::allocator<char>::~allocator(&local_5c1);
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_5a0);
    if (pDVar5 == (pointer)0x0) {
      pHeaderFieldNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>.
      _M_t.super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
      super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._6_1_ = 1;
      pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e8,"<header> section not found in data dictionary",
                 (allocator<char> *)
                 ((long)&pHeaderFieldNode._M_t.
                         super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
                         super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl + 7));
      ConfigError::ConfigError(pCVar6,&local_5e8);
      pHeaderFieldNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>.
      _M_t.super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
      super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._6_1_ = 0;
      __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
    }
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_5a0);
    (*pDVar5->_vptr_DOMNode[2])(&local_5f8);
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_5f8);
    if (pDVar5 == (pointer)0x0) {
      local_61a = 1;
      pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_618,"No header fields defined",&local_619);
      ConfigError::ConfigError(pCVar6,&local_618);
      local_61a = 0;
      __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
    }
    while (pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get
                              (&local_5f8), pDVar5 != (pointer)0x0) {
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_5f8);
      (*pDVar5->_vptr_DOMNode[5])(&local_640);
      bVar1 = std::operator==(&local_640,"field");
      local_f22 = true;
      if (!bVar1) {
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_5f8);
        (*pDVar5->_vptr_DOMNode[5])(&local_660);
        local_f22 = std::operator==(&local_660,"group");
        std::__cxx11::string::~string((string *)&local_660);
      }
      std::__cxx11::string::~string((string *)&local_640);
      if (local_f22 != false) {
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_5f8);
        (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&name_1.field_2 + 8));
        std::__cxx11::string::string((string *)local_690);
        pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                 operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                             *)((long)&name_1.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_6b0,"name",&local_6b1);
        iVar3 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_6b0,local_690);
        std::__cxx11::string::~string(local_6b0);
        std::allocator<char>::~allocator(&local_6b1);
        if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
          required.field_2._M_local_buf[0xe] = '\x01';
          pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6d8,"<field> does not have a name attribute",
                     (allocator<char> *)(required.field_2._M_local_buf + 0xf));
          ConfigError::ConfigError(pCVar6,&local_6d8);
          required.field_2._M_local_buf[0xe] = '\0';
          __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
        }
        std::__cxx11::string::string((string *)local_700);
        pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                 operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                             *)((long)&name_1.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_720,"required",&local_721);
        (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_720,local_700);
        std::__cxx11::string::~string(local_720);
        std::allocator<char>::~allocator(&local_721);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_700,"Y");
        local_f62 = true;
        if (!bVar1) {
          local_f62 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_700,"y");
        }
        pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::get
                           ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
                            pFixNode._M_t.
                            super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>
                            .super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl);
        iVar3 = lookupXMLFieldNumber(this,pDVar4,(string *)local_690);
        addHeaderField(this,iVar3,local_f62);
        std::__cxx11::string::~string((string *)local_700);
        std::__cxx11::string::~string((string *)local_690);
        std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                  ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                   ((long)&name_1.field_2 + 8));
      }
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_5f8);
      (*pDVar5->_vptr_DOMNode[5])(&attrs_4);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &attrs_4,"group");
      std::__cxx11::string::~string((string *)&attrs_4);
      if (bVar1) {
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_5f8);
        (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&required_1.field_2 + 8));
        std::__cxx11::string::string((string *)local_770);
        pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                 operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                             *)((long)&required_1.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_790,"required",&local_791);
        (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_790,local_770);
        std::__cxx11::string::~string(local_790);
        std::allocator<char>::~allocator(&local_791);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_770,"Y");
        local_f82 = true;
        if (!bVar1) {
          local_f82 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_770,"y");
        }
        local_792 = local_f82;
        pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::get
                           ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
                            pFixNode._M_t.
                            super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>
                            .super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl);
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_5f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b8,"_header_",&local_7b9);
        addXMLGroup(this,pDVar4,pDVar5,&local_7b8,this,(bool)(local_792 & 1));
        std::__cxx11::string::~string((string *)&local_7b8);
        std::allocator<char>::~allocator(&local_7b9);
        std::__cxx11::string::~string((string *)local_770);
        std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                  ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                   ((long)&required_1.field_2 + 8));
      }
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_5f8);
      (*pDVar5->_vptr_DOMNode[3])(&pTrailerNode);
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::release
                         (&pTrailerNode);
      std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::reset(&local_5f8,pDVar5);
      std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&pTrailerNode);
    }
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_5f8);
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_5a0);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a8,"FIXT");
  if ((bVar1) ||
     ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a8,"FIX"), bVar1 &&
      (bVar1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_120,"5"), bVar1)))) {
    pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::operator->
                       ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
                        pFixNode._M_t.
                        super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t
                        .super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
                        super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_7f0,"/fix/trailer",&local_7f1);
    (*pDVar4->_vptr_DOMDocument[5])(&local_7d0,pDVar4,local_7f0);
    std::__cxx11::string::~string(local_7f0);
    std::allocator<char>::~allocator(&local_7f1);
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_7d0);
    if (pDVar5 == (pointer)0x0) {
      pTrailerFieldNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>
      ._M_t.super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
      super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._6_1_ = 1;
      pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_818,"<trailer> section not found in data dictionary",
                 (allocator<char> *)
                 ((long)&pTrailerFieldNode._M_t.
                         super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
                         super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl + 7));
      ConfigError::ConfigError(pCVar6,&local_818);
      pTrailerFieldNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>
      ._M_t.super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
      super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._6_1_ = 0;
      __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
    }
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_7d0);
    (*pDVar5->_vptr_DOMNode[2])(&local_828);
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_828);
    if (pDVar5 == (pointer)0x0) {
      local_84a = 1;
      pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_848,"No trailer fields defined",&local_849);
      ConfigError::ConfigError(pCVar6,&local_848);
      local_84a = 0;
      __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
    }
    while (pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get
                              (&local_828), pDVar5 != (pointer)0x0) {
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_828);
      (*pDVar5->_vptr_DOMNode[5])(&local_870);
      bVar1 = std::operator==(&local_870,"field");
      local_fda = true;
      if (!bVar1) {
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_828);
        (*pDVar5->_vptr_DOMNode[5])(&local_890);
        local_fda = std::operator==(&local_890,"group");
        std::__cxx11::string::~string((string *)&local_890);
      }
      std::__cxx11::string::~string((string *)&local_870);
      if (local_fda != false) {
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_828);
        (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&name_2.field_2 + 8));
        std::__cxx11::string::string((string *)local_8c0);
        pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                 operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                             *)((long)&name_2.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_8e0,"name",&local_8e1);
        iVar3 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_8e0,local_8c0);
        std::__cxx11::string::~string(local_8e0);
        std::allocator<char>::~allocator(&local_8e1);
        if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
          required_2.field_2._M_local_buf[0xe] = '\x01';
          pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_908,"<field> does not have a name attribute",
                     (allocator<char> *)(required_2.field_2._M_local_buf + 0xf));
          ConfigError::ConfigError(pCVar6,&local_908);
          required_2.field_2._M_local_buf[0xe] = '\0';
          __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
        }
        std::__cxx11::string::string((string *)local_930);
        pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                 operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                             *)((long)&name_2.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_950,"required",&local_951);
        (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_950,local_930);
        std::__cxx11::string::~string(local_950);
        std::allocator<char>::~allocator(&local_951);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_930,"Y");
        local_101a = true;
        if (!bVar1) {
          local_101a = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_930,"y");
        }
        pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::get
                           ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
                            pFixNode._M_t.
                            super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>
                            .super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl);
        iVar3 = lookupXMLFieldNumber(this,pDVar4,(string *)local_8c0);
        addTrailerField(this,iVar3,local_101a);
        std::__cxx11::string::~string((string *)local_930);
        std::__cxx11::string::~string((string *)local_8c0);
        std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                  ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                   ((long)&name_2.field_2 + 8));
      }
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_828);
      (*pDVar5->_vptr_DOMNode[5])(&attrs_6);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &attrs_6,"group");
      std::__cxx11::string::~string((string *)&attrs_6);
      if (bVar1) {
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_828);
        (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&required_3.field_2 + 8));
        std::__cxx11::string::string((string *)local_9a0);
        pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                 operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                             *)((long)&required_3.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_9c0,"required",&local_9c1);
        (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_9c0,local_9a0);
        std::__cxx11::string::~string(local_9c0);
        std::allocator<char>::~allocator(&local_9c1);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_9a0,"Y");
        local_103a = true;
        if (!bVar1) {
          local_103a = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_9a0,"y");
        }
        local_9c2 = local_103a;
        pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::get
                           ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
                            pFixNode._M_t.
                            super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>
                            .super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl);
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_828);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9e8,"_trailer_",&local_9e9);
        addXMLGroup(this,pDVar4,pDVar5,&local_9e8,this,(bool)(local_9c2 & 1));
        std::__cxx11::string::~string((string *)&local_9e8);
        std::allocator<char>::~allocator(&local_9e9);
        std::__cxx11::string::~string((string *)local_9a0);
        std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                  ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                   ((long)&required_3.field_2 + 8));
      }
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_828);
      (*pDVar5->_vptr_DOMNode[3])(&pMessagesNode);
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::release
                         (&pMessagesNode);
      std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::reset(&local_828,pDVar5);
      std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&pMessagesNode)
      ;
    }
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_828);
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_7d0);
  }
  pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::operator->
                     ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
                      pFixNode._M_t.
                      super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t.
                      super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
                      super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a20,"/fix/messages",&local_a21);
  (*pDVar4->_vptr_DOMDocument[5])(&local_a00,pDVar4,local_a20);
  std::__cxx11::string::~string(local_a20);
  std::allocator<char>::~allocator(&local_a21);
  pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_a00);
  if (pDVar5 == (pointer)0x0) {
    pMessageNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t.
    super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
    super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._6_1_ = 1;
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a48,"<messages> section not found in data dictionary",
               (allocator<char> *)
               ((long)&pMessageNode._M_t.
                       super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t.
                       super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
                       super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl + 7));
    ConfigError::ConfigError(pCVar6,&local_a48);
    pMessageNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t.
    super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
    super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._6_1_ = 0;
    __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->(&local_a00)
  ;
  (*pDVar5->_vptr_DOMNode[2])(&local_a58);
  pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_a58);
  if (pDVar5 != (pointer)0x0) {
    do {
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_a58);
      if (pDVar5 == (pointer)0x0) {
        std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_a58);
        std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_a00);
        std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_2c0);
        std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_268);
        std::__cxx11::string::~string((string *)local_190);
        std::__cxx11::string::~string((string *)local_120);
        std::__cxx11::string::~string((string *)local_a8);
        std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                  ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                   ((long)&type.field_2 + 8));
        std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_20);
        return;
      }
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_a58);
      (*pDVar5->_vptr_DOMNode[5])(&attrs_7);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &attrs_7,"message");
      std::__cxx11::string::~string((string *)&attrs_7);
      if (bVar1) {
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_a58);
        (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&msgtype.field_2 + 8));
        std::__cxx11::string::string((string *)local_ac8);
        pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                 operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                             *)((long)&msgtype.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_ae8,"msgtype",&local_ae9);
        iVar3 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_ae8,local_ac8);
        std::__cxx11::string::~string(local_ae8);
        std::allocator<char>::~allocator(&local_ae9);
        if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
          name_3.field_2._M_local_buf[0xe] = '\x01';
          pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b10,"<message> does not have a msgtype attribute",
                     (allocator<char> *)(name_3.field_2._M_local_buf + 0xf));
          ConfigError::ConfigError(pCVar6,&local_b10);
          name_3.field_2._M_local_buf[0xe] = '\0';
          __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
        }
        addMsgType(this,(string *)local_ac8);
        std::__cxx11::string::string((string *)local_b38);
        pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                 operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                             *)((long)&msgtype.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_b58,"name",
                   (allocator<char> *)
                   ((long)&pMessageFieldNode._M_t.
                           super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>
                           .super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl + 7));
        uVar2 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_b58,local_b38);
        std::__cxx11::string::~string(local_b58);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&pMessageFieldNode._M_t.
                           super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>
                           .super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl + 7));
        if ((uVar2 & 1) != 0) {
          addValueName(this,0x23,(string *)local_ac8,(string *)local_b38);
        }
        pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_a58);
        (*pDVar5->_vptr_DOMNode[2])(&local_b68);
        while (pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get
                                  (&local_b68), pDVar5 != (pointer)0x0) {
          pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                             (&local_b68);
          (*pDVar5->_vptr_DOMNode[5])(&local_b88);
          bVar1 = std::operator==(&local_b88,"field");
          local_10cb = true;
          if (!bVar1) {
            pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                               (&local_b68);
            (*pDVar5->_vptr_DOMNode[5])(&local_ba8);
            local_10cb = std::operator==(&local_ba8,"group");
            std::__cxx11::string::~string((string *)&local_ba8);
          }
          std::__cxx11::string::~string((string *)&local_b88);
          if (local_10cb == false) {
            pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                               (&local_b68);
            (*pDVar5->_vptr_DOMNode[5])(&attrs_9);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&attrs_9,"component");
            std::__cxx11::string::~string((string *)&attrs_9);
            if (bVar1) {
              pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                                 (&local_b68);
              (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&required_5.field_2 + 8));
              std::__cxx11::string::string((string *)local_cb8);
              pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                       ::operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                                     *)((long)&required_5.field_2 + 8));
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>(local_cd8,"required",&local_cd9);
              (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_cd8,local_cb8);
              std::__cxx11::string::~string(local_cd8);
              std::allocator<char>::~allocator(&local_cd9);
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_cb8,"Y");
              local_112a = true;
              if (!bVar1) {
                local_112a = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_cb8,"y");
              }
              pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::
                       get((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
                           pFixNode._M_t.
                           super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>
                           .super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl);
              pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get
                                 (&local_b68);
              addXMLComponentFields(this,pDVar4,pDVar5,(string *)local_ac8,this,local_112a);
              std::__cxx11::string::~string((string *)local_cb8);
              std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
              ~unique_ptr((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                           *)((long)&required_5.field_2 + 8));
            }
          }
          else {
            pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                               (&local_b68);
            (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&name_4.field_2 + 8));
            std::__cxx11::string::string((string *)local_bd8);
            pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                     operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                                 *)((long)&name_4.field_2 + 8));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_bf8,"name",&local_bf9);
            iVar3 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_bf8,local_bd8);
            std::__cxx11::string::~string(local_bf8);
            std::allocator<char>::~allocator(&local_bf9);
            if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
              required_4.field_2._M_local_buf[0xe] = '\x01';
              pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&num_1,"<field> does not have a name attribute",
                         (allocator<char> *)(required_4.field_2._M_local_buf + 0xf));
              ConfigError::ConfigError(pCVar6,(string *)&num_1);
              required_4.field_2._M_local_buf[0xe] = '\0';
              __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
            }
            pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::get
                               ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>
                                 *)pFixNode._M_t.
                                   super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>
                                   .super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl);
            required_4.field_2._8_4_ = lookupXMLFieldNumber(this,pDVar4,(string *)local_bd8);
            addMsgField(this,(string *)local_ac8,required_4.field_2._8_4_);
            std::__cxx11::string::string((string *)local_c48);
            pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                     operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                                 *)((long)&name_4.field_2 + 8));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_c68,"required",&local_c69);
            uVar2 = (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_c68,local_c48);
            local_1112 = false;
            if ((uVar2 & 1) != 0) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c48,"Y");
              local_1114 = true;
              if (!bVar1) {
                local_1114 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_c48,"y");
              }
              local_1112 = local_1114;
            }
            std::__cxx11::string::~string(local_c68);
            std::allocator<char>::~allocator(&local_c69);
            if (local_1112 != false) {
              addRequiredField(this,(string *)local_ac8,required_4.field_2._8_4_);
            }
            std::__cxx11::string::~string((string *)local_c48);
            std::__cxx11::string::~string((string *)local_bd8);
            std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
            ~unique_ptr((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                        ((long)&name_4.field_2 + 8));
          }
          pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                             (&local_b68);
          (*pDVar5->_vptr_DOMNode[5])(&attrs_10);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&attrs_10,"group");
          std::__cxx11::string::~string((string *)&attrs_10);
          if (bVar1) {
            pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                               (&local_b68);
            (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&required_6.field_2 + 8));
            std::__cxx11::string::string((string *)local_d28);
            pDVar7 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                     operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                                 *)((long)&required_6.field_2 + 8));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_d48,"required",&local_d49);
            (*pDVar7->_vptr_DOMAttributes[2])(pDVar7,local_d48,local_d28);
            std::__cxx11::string::~string(local_d48);
            std::allocator<char>::~allocator(&local_d49);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_d28,"Y");
            local_1152 = true;
            if (!bVar1) {
              local_1152 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_d28,"y");
            }
            local_d4a = local_1152;
            pDVar4 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::get
                               ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>
                                 *)pFixNode._M_t.
                                   super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>
                                   .super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl);
            pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get
                               (&local_b68);
            addXMLGroup(this,pDVar4,pDVar5,(string *)local_ac8,this,(bool)(local_d4a & 1));
            std::__cxx11::string::~string((string *)local_d28);
            std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
            ~unique_ptr((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                        ((long)&required_6.field_2 + 8));
          }
          pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                             (&local_b68);
          (*pDVar5->_vptr_DOMNode[3])(&local_d58);
          pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::release
                             (&local_d58);
          std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::reset
                    (&local_b68,pDVar5);
          std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_d58)
          ;
        }
        std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_b68);
        std::__cxx11::string::~string((string *)local_b38);
        std::__cxx11::string::~string((string *)local_ac8);
        std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                  ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                   ((long)&msgtype.field_2 + 8));
      }
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_a58);
      (*pDVar5->_vptr_DOMNode[3])(&local_d60);
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::release
                         (&local_d60);
      std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::reset(&local_a58,pDVar5);
      std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_d60);
    } while( true );
  }
  pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a78,"No messages defined",&local_a79);
  ConfigError::ConfigError(pCVar6,&local_a78);
  __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
}

Assistant:

EXCEPT(ConfigError) {
  // VERSION
  DOMNodePtr pFixNode = pDoc->getNode("/fix");
  if (!pFixNode.get()) {
    throw ConfigError("Could not parse data dictionary file"
                      ", or no <fix> node found at root");
  }
  DOMAttributesPtr attrs = pFixNode->getAttributes();
  std::string type = "FIX";
  if (attrs->get("type", type)) {
    if (type != "FIX" && type != "FIXT") {
      throw ConfigError("type attribute must be FIX or FIXT");
    }
  }
  std::string major;
  if (!attrs->get("major", major)) {
    throw ConfigError("major attribute not found on <fix>");
  }
  std::string minor;
  if (!attrs->get("minor", minor)) {
    throw ConfigError("minor attribute not found on <fix>");
  }
  setVersion(type + "." + major + "." + minor);

  // FIELDS
  DOMNodePtr pFieldsNode = pDoc->getNode("/fix/fields");
  if (!pFieldsNode.get()) {
    throw ConfigError("<fields> section not found in data dictionary");
  }

  DOMNodePtr pFieldNode = pFieldsNode->getFirstChildNode();
  if (!pFieldNode.get()) {
    throw ConfigError("No fields defined");
  }

  while (pFieldNode.get()) {
    if (pFieldNode->getName() == "field") {
      DOMAttributesPtr attrs = pFieldNode->getAttributes();
      std::string name;
      if (!attrs->get("name", name)) {
        throw ConfigError("<field> does not have a name attribute");
      }
      std::string number;
      if (!attrs->get("number", number)) {
        throw ConfigError("<field> " + name + " does not have a number attribute");
      }
      int num = atoi(number.c_str());
      std::string type;
      if (!attrs->get("type", type)) {
        throw ConfigError("<field> " + name + " does not have a type attribute");
      }
      addField(num);
      addFieldType(num, XMLTypeToType(type));
      addFieldName(num, name);

      DOMNodePtr pFieldValueNode = pFieldNode->getFirstChildNode();
      while (pFieldValueNode.get()) {
        if (pFieldValueNode->getName() == "value") {
          DOMAttributesPtr attrs = pFieldValueNode->getAttributes();
          std::string enumeration;
          if (!attrs->get("enum", enumeration)) {
            throw ConfigError("<value> does not have enum attribute in field " + name);
          }
          addFieldValue(num, enumeration);
          std::string description;
          if (attrs->get("description", description)) {
            addValueName(num, enumeration, description);
          }
        }
        RESET_AUTO_PTR(pFieldValueNode, pFieldValueNode->getNextSiblingNode());
      }
    }
    RESET_AUTO_PTR(pFieldNode, pFieldNode->getNextSiblingNode());
  }

  // HEADER
  if (type == "FIXT" || (type == "FIX" && major < "5")) {
    DOMNodePtr pHeaderNode = pDoc->getNode("/fix/header");
    if (!pHeaderNode.get()) {
      throw ConfigError("<header> section not found in data dictionary");
    }

    DOMNodePtr pHeaderFieldNode = pHeaderNode->getFirstChildNode();
    if (!pHeaderFieldNode.get()) {
      throw ConfigError("No header fields defined");
    }

    while (pHeaderFieldNode.get()) {
      if (pHeaderFieldNode->getName() == "field" || pHeaderFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pHeaderFieldNode->getAttributes();
        std::string name;
        if (!attrs->get("name", name)) {
          throw ConfigError("<field> does not have a name attribute");
        }
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addHeaderField(lookupXMLFieldNumber(pDoc.get(), name), isRequired);
      }
      if (pHeaderFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pHeaderFieldNode->getAttributes();
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addXMLGroup(pDoc.get(), pHeaderFieldNode.get(), "_header_", *this, isRequired);
      }

      RESET_AUTO_PTR(pHeaderFieldNode, pHeaderFieldNode->getNextSiblingNode());
    }
  }

  // TRAILER
  if (type == "FIXT" || (type == "FIX" && major < "5")) {
    DOMNodePtr pTrailerNode = pDoc->getNode("/fix/trailer");
    if (!pTrailerNode.get()) {
      throw ConfigError("<trailer> section not found in data dictionary");
    }

    DOMNodePtr pTrailerFieldNode = pTrailerNode->getFirstChildNode();
    if (!pTrailerFieldNode.get()) {
      throw ConfigError("No trailer fields defined");
    }

    while (pTrailerFieldNode.get()) {
      if (pTrailerFieldNode->getName() == "field" || pTrailerFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pTrailerFieldNode->getAttributes();
        std::string name;
        if (!attrs->get("name", name)) {
          throw ConfigError("<field> does not have a name attribute");
        }
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addTrailerField(lookupXMLFieldNumber(pDoc.get(), name), isRequired);
      }
      if (pTrailerFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pTrailerFieldNode->getAttributes();
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addXMLGroup(pDoc.get(), pTrailerFieldNode.get(), "_trailer_", *this, isRequired);
      }

      RESET_AUTO_PTR(pTrailerFieldNode, pTrailerFieldNode->getNextSiblingNode());
    }
  }

  // MSGTYPE
  DOMNodePtr pMessagesNode = pDoc->getNode("/fix/messages");
  if (!pMessagesNode.get()) {
    throw ConfigError("<messages> section not found in data dictionary");
  }

  DOMNodePtr pMessageNode = pMessagesNode->getFirstChildNode();
  if (!pMessageNode.get()) {
    throw ConfigError("No messages defined");
  }

  while (pMessageNode.get()) {
    if (pMessageNode->getName() == "message") {
      DOMAttributesPtr attrs = pMessageNode->getAttributes();
      std::string msgtype;
      if (!attrs->get("msgtype", msgtype)) {
        throw ConfigError("<message> does not have a msgtype attribute");
      }
      addMsgType(msgtype);

      std::string name;
      if (attrs->get("name", name)) {
        addValueName(35, msgtype, name);
      }

      DOMNodePtr pMessageFieldNode = pMessageNode->getFirstChildNode();
      while (pMessageFieldNode.get()) {
        if (pMessageFieldNode->getName() == "field" || pMessageFieldNode->getName() == "group") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string name;
          if (!attrs->get("name", name)) {
            throw ConfigError("<field> does not have a name attribute");
          }
          int num = lookupXMLFieldNumber(pDoc.get(), name);
          addMsgField(msgtype, num);

          std::string required;
          if (attrs->get("required", required) && (required == "Y" || required == "y")) {
            addRequiredField(msgtype, num);
          }
        } else if (pMessageFieldNode->getName() == "component") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string required;
          attrs->get("required", required);
          bool isRequired = (required == "Y" || required == "y");
          addXMLComponentFields(pDoc.get(), pMessageFieldNode.get(), msgtype, *this, isRequired);
        }
        if (pMessageFieldNode->getName() == "group") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string required;
          attrs->get("required", required);
          bool isRequired = (required == "Y" || required == "y");
          addXMLGroup(pDoc.get(), pMessageFieldNode.get(), msgtype, *this, isRequired);
        }
        RESET_AUTO_PTR(pMessageFieldNode, pMessageFieldNode->getNextSiblingNode());
      }
    }
    RESET_AUTO_PTR(pMessageNode, pMessageNode->getNextSiblingNode());
  }
}